

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O1

shared_ptr<cppnet::BufferQueue> __thiscall
cppnet::AlloterWrap::
PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
          (AlloterWrap *this,shared_ptr<cppnet::BlockMemoryPool> *args,
          shared_ptr<cppnet::AlloterWrap> *args_1)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  shared_ptr<cppnet::AlloterWrap> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppnet::BufferQueue> sVar3;
  BufferQueue *this_00;
  
  peVar1 = (args->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = (*peVar1->_vptr_BlockMemoryPool[3])(peVar1,0x68);
  this_00 = (BufferQueue *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (BufferQueue *)0x0) {
    this_00 = (BufferQueue *)0x0;
  }
  else {
    BufferQueue::BufferQueue(this_00,(shared_ptr<cppnet::BlockMemoryPool> *)args_1,in_RCX);
  }
  (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::BufferQueue*,cppnet::AlloterWrap::PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>(std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&)::_lambda(cppnet::BufferQueue*)_1_,std::allocator<void>,void>
            (&(this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00,args);
  sVar3.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BufferQueue>)
         sVar3.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> AlloterWrap::PoolNewSharePtr(Args&&... args) {
    T* ret = PoolNew<T>(std::forward<Args>(args)...);
    return std::shared_ptr<T>(ret, [this](T* c) { PoolDelete(c); });
}